

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * __thiscall Pathie::Path::operator/=(Path *this,string *str)

{
  Path local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)str);
  join(&local_50,this,&local_30);
  operator=(this,&local_50);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return this;
}

Assistant:

Path& Path::operator/=(std::string str)
{
  *this = join(str);
  return *this;
}